

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExternalCall.cpp
# Opt level: O2

int TestExtM2(double x1,double x2,double x3,double x4,int y)

{
  double dVar1;
  
  dVar1 = floor(x1 + 0.5);
  return (int)(x4 == 4.0 &&
              (x3 == 3.0 && (x2 == 2.0 && (y != 0 && (int)(((x1 + 0.5) - dVar1) * 10.0) == 1))));
}

Assistant:

int TestExtM2(double x1, double x2, double x3, double x4, int y)
{
#define fpart(x) (x - floor(x))
	double xgap = fpart(x1 + 0.5);
	return int(xgap * 10.0) == 1 && y && x2 == 2.0 && x3 == 3.0 && x4 == 4.0;
#undef fpart
}